

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

void leveldb_approximate_sizes
               (leveldb_t *db,int num_ranges,char **range_start_key,size_t *range_start_key_len,
               char **range_limit_key,size_t *range_limit_key_len,uint64_t *sizes)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Range *local_80;
  Slice local_68;
  Slice local_58;
  int local_44;
  Range *pRStack_40;
  int i;
  Range *ranges;
  size_t *range_limit_key_len_local;
  char **range_limit_key_local;
  size_t *range_start_key_len_local;
  char **range_start_key_local;
  leveldb_t *plStack_10;
  int num_ranges_local;
  leveldb_t *db_local;
  
  uVar2 = (ulong)num_ranges;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x20),0);
  if (SUB168(auVar1 * ZEXT816(0x20),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ranges = (Range *)range_limit_key_len;
  range_limit_key_len_local = (size_t *)range_limit_key;
  range_limit_key_local = (char **)range_start_key_len;
  range_start_key_len_local = (size_t *)range_start_key;
  range_start_key_local._4_4_ = num_ranges;
  plStack_10 = db;
  pRStack_40 = (Range *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_80 = pRStack_40;
    do {
      leveldb::Range::Range(local_80);
      local_80 = local_80 + 1;
    } while (local_80 != pRStack_40 + uVar2);
  }
  for (local_44 = 0; local_44 < (int)range_start_key_local._4_4_; local_44 = local_44 + 1) {
    leveldb::Slice::Slice
              (&local_58,(char *)range_start_key_len_local[local_44],
               (size_t)range_limit_key_local[local_44]);
    pRStack_40[local_44].start.data_ = local_58.data_;
    pRStack_40[local_44].start.size_ = local_58.size_;
    leveldb::Slice::Slice
              (&local_68,(char *)range_limit_key_len_local[local_44],
               (size_t)(&(ranges->start).data_)[local_44]);
    pRStack_40[local_44].limit.data_ = local_68.data_;
    pRStack_40[local_44].limit.size_ = local_68.size_;
  }
  (*plStack_10->rep->_vptr_DB[10])
            (plStack_10->rep,pRStack_40,(ulong)range_start_key_local._4_4_,sizes);
  if (pRStack_40 != (Range *)0x0) {
    operator_delete__(pRStack_40);
  }
  return;
}

Assistant:

void leveldb_approximate_sizes(leveldb_t* db, int num_ranges,
                               const char* const* range_start_key,
                               const size_t* range_start_key_len,
                               const char* const* range_limit_key,
                               const size_t* range_limit_key_len,
                               uint64_t* sizes) {
  Range* ranges = new Range[num_ranges];
  for (int i = 0; i < num_ranges; i++) {
    ranges[i].start = Slice(range_start_key[i], range_start_key_len[i]);
    ranges[i].limit = Slice(range_limit_key[i], range_limit_key_len[i]);
  }
  db->rep->GetApproximateSizes(ranges, num_ranges, sizes);
  delete[] ranges;
}